

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O0

void api_suite::api_clear(void)

{
  undefined4 local_54;
  size_type local_50;
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  circular_array<int,_4UL> data;
  
  vista::circular_array<int,_4UL>::circular_array((circular_array<int,_4UL> *)local_30);
  vista::circular_view<int,_4UL>::push_back
            ((circular_view<int,_4UL> *)(data.super_array<int,_4UL>._M_elems + 2),0xb);
  local_40[0] = vista::circular_view<int,_4UL>::size
                          ((circular_view<int,_4UL> *)(data.super_array<int,_4UL>._M_elems + 2));
  local_44 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xa9,"void api_suite::api_clear()",local_40,&local_44);
  vista::circular_view<int,_4UL>::clear
            ((circular_view<int,_4UL> *)(data.super_array<int,_4UL>._M_elems + 2));
  local_50 = vista::circular_view<int,_4UL>::size
                       ((circular_view<int,_4UL> *)(data.super_array<int,_4UL>._M_elems + 2));
  local_54 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xab,"void api_suite::api_clear()",&local_50,&local_54);
  return;
}

Assistant:

void api_clear()
{
    circular_array<int, 4> data;
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 1);
    data.clear();
    BOOST_TEST_EQ(data.size(), 0);
}